

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity_test.cc
# Opt level: O1

void __thiscall
(anonymous_namespace)::____C_A_T_C_H____T_E_S_T____26::test()::ComponentAddedEventReceiver::
receive(entityx::ComponentAddedEvent<Direction>_const__
          (void *this,ComponentAddedEvent<Direction> *event)

{
  EntityManager *pEVar1;
  long lVar2;
  Family FVar3;
  long lVar4;
  ulong uVar5;
  uint in_XMM0_Db;
  uint in_XMM0_Dc;
  uint in_XMM0_Dd;
  float local_bc;
  float local_b8;
  uint uStack_b4;
  uint uStack_b0;
  uint uStack_ac;
  AssertionHandler local_a8;
  undefined **local_60;
  undefined1 local_58;
  undefined1 local_57;
  float *local_50;
  char *local_48;
  undefined8 local_40;
  float *local_38;
  
  pEVar1 = (event->component).manager_;
  uVar5 = (ulong)(uint)(event->component).id_.id_;
  local_b8 = (float)*(int *)((long)this + 0x44);
  local_a8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_a8.m_assertionInfo.macroName.m_size = 7;
  local_a8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
  ;
  local_a8.m_assertionInfo.lineInfo.line = 0x168;
  local_a8.m_assertionInfo.capturedExpression.m_start = "p->x == -n";
  local_a8.m_assertionInfo.capturedExpression.m_size = 10;
  local_a8.m_assertionInfo.resultDisposition = Normal;
  local_a8.m_reaction.shouldDebugBreak = false;
  local_a8.m_reaction.shouldThrow = false;
  local_a8.m_completed = false;
  uStack_b4 = in_XMM0_Db;
  uStack_b0 = in_XMM0_Dc;
  uStack_ac = in_XMM0_Dd;
  local_a8.m_resultCapture = Catch::getResultCapture();
  FVar3 = entityx::Component<Direction>::family();
  lVar2 = *(long *)(*(long *)(pEVar1 + 0x18) + FVar3 * 8);
  lVar4 = (uVar5 % *(ulong *)(lVar2 + 0x28)) * *(long *)(lVar2 + 0x20);
  lVar2 = *(long *)(*(long *)(lVar2 + 8) + (uVar5 / *(ulong *)(lVar2 + 0x28)) * 8);
  local_bc = -local_b8;
  uStack_b4 = uStack_b4 ^ 0x80000000;
  uStack_b0 = uStack_b0 ^ 0x80000000;
  uStack_ac = uStack_ac ^ 0x80000000;
  local_57 = local_bc == *(float *)(lVar2 + lVar4);
  local_50 = (float *)(lVar2 + lVar4);
  local_58 = 1;
  local_60 = &PTR_streamReconstructedExpression_001f3d88;
  local_48 = "==";
  local_40 = 2;
  local_b8 = local_bc;
  local_38 = &local_bc;
  (*(local_a8.m_resultCapture)->_vptr_IResultCapture[10])
            (local_a8.m_resultCapture,&local_a8,&local_60,&local_a8.m_reaction);
  Catch::AssertionHandler::complete(&local_a8);
  if (local_a8.m_completed == false) {
    (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  local_a8.m_assertionInfo.macroName.m_start = "REQUIRE";
  local_a8.m_assertionInfo.macroName.m_size = 7;
  local_a8.m_assertionInfo.lineInfo.file =
       "/workspace/llm4binary/github/license_c_cmakelists/alecthomas[P]entityx/entityx/Entity_test.cc"
  ;
  local_a8.m_assertionInfo.lineInfo.line = 0x169;
  local_a8.m_assertionInfo.capturedExpression.m_start = "p->y == -n";
  local_a8.m_assertionInfo.capturedExpression.m_size = 10;
  local_a8.m_assertionInfo.resultDisposition = Normal;
  local_a8.m_reaction.shouldDebugBreak = false;
  local_a8.m_reaction.shouldThrow = false;
  local_a8.m_completed = false;
  local_a8.m_resultCapture = Catch::getResultCapture();
  FVar3 = entityx::Component<Direction>::family();
  lVar2 = *(long *)(*(long *)(pEVar1 + 0x18) + FVar3 * 8);
  local_50 = (float *)(*(long *)(*(long *)(lVar2 + 8) + (uVar5 / *(ulong *)(lVar2 + 0x28)) * 8) +
                       (uVar5 % *(ulong *)(lVar2 + 0x28)) * *(long *)(lVar2 + 0x20) + 4);
  local_bc = local_b8;
  local_57 = local_b8 == *local_50;
  local_58 = 1;
  local_60 = &PTR_streamReconstructedExpression_001f3d88;
  local_48 = "==";
  local_40 = 2;
  local_38 = &local_bc;
  (*(local_a8.m_resultCapture)->_vptr_IResultCapture[10])
            (local_a8.m_resultCapture,&local_a8,&local_60,&local_a8.m_reaction);
  Catch::AssertionHandler::complete(&local_a8);
  if (local_a8.m_completed == false) {
    (*(local_a8.m_resultCapture)->_vptr_IResultCapture[0xe])();
  }
  *(int *)((long)this + 0x44) = *(int *)((long)this + 0x44) + 1;
  return;
}

Assistant:

void receive(const ComponentAddedEvent<Direction> &event) {
      auto p = event.component;
      float n = static_cast<float>(direction_events);
      REQUIRE(p->x ==  -n);
      REQUIRE(p->y ==  -n);
      direction_events++;
    }